

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::JumpToCacheEntry(cmCursesMainForm *this,char *astr)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  FIELD *pFVar5;
  long *plVar6;
  char *__s;
  long lVar7;
  string str;
  string cfld;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (astr != (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar4 = strlen(astr);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,astr,astr + sVar4);
    cmsys::SystemTools::LowerCase(&local_50,&local_90);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68 != 0) {
    pFVar5 = current_field((this->super_cmCursesForm).Form);
    uVar2 = field_index(pFVar5);
    uVar3 = uVar2;
    do {
      if (local_68 != 0) {
        if ((int)uVar3 < 0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)field_userptr(this->Fields[(ulong)uVar3 - 2]);
        }
        if (plVar6 != (long *)0x0) {
          __s = (char *)(**(code **)(*plVar6 + 0x28))(plVar6);
          if (__s != (char *)0x0) {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            sVar4 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar4);
            cmsys::SystemTools::LowerCase(&local_50,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            lVar7 = std::__cxx11::string::find((char *)&local_50,(ulong)local_70,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (lVar7 != -1 && uVar3 != uVar2) break;
          }
        }
      }
      if ((ulong)(long)(int)uVar3 < this->NumberOfVisibleEntries * 3 - 1) {
        _Var1 = new_page(this->Fields[(long)(int)uVar3 + 1]);
        form_driver((this->super_cmCursesForm).Form,(uint)!_Var1 * 4 + 0x200);
      }
      else {
        set_current_field((this->super_cmCursesForm).Form,this->Fields[2]);
      }
      pFVar5 = current_field((this->super_cmCursesForm).Form);
      uVar3 = field_index(pFVar5);
    } while (uVar3 != uVar2);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void cmCursesMainForm::JumpToCacheEntry(const char* astr)
{
  std::string str;
  if (astr) {
    str = cmSystemTools::LowerCase(astr);
  }

  if (str.empty()) {
    return;
  }
  FIELD* cur = current_field(this->Form);
  int start_index = field_index(cur);
  int findex = start_index;
  for (;;) {
    if (!str.empty()) {
      cmCursesWidget* lbl = nullptr;
      if (findex >= 0) {
        lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
      }
      if (lbl) {
        const char* curField = lbl->GetValue();
        if (curField) {
          std::string cfld = cmSystemTools::LowerCase(curField);
          if (cfld.find(str) != std::string::npos && findex != start_index) {
            break;
          }
        }
      }
    }
    if (size_t(findex) >= 3 * this->NumberOfVisibleEntries - 1) {
      set_current_field(this->Form, this->Fields[2]);
    } else if (new_page(this->Fields[findex + 1])) {
      form_driver(this->Form, REQ_NEXT_PAGE);
    } else {
      form_driver(this->Form, REQ_NEXT_FIELD);
    }
    /*
    char buffer[1024];
    sprintf(buffer, "Line: %d != %d / %d\n", findex, idx,
    this->NumberOfVisibleEntries);
    touchwin(stdscr);
    refresh();
    this->UpdateStatusBar( buffer );
    usleep(100000);
    */
    cur = current_field(this->Form);
    findex = field_index(cur);
    if (findex == start_index) {
      break;
    }
  }
}